

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O0

int create_header(char *filename,uint32_t w,uint32_t h,uint8_t *data)

{
  int iVar1;
  undefined1 local_6b [3];
  int index;
  undefined1 local_64;
  uchar bmppad [3];
  uchar bmpinfoheader [40];
  undefined8 local_32;
  uchar bmpfileheader [14];
  uint32_t filesize;
  uint8_t *data_local;
  uint32_t h_local;
  uint32_t w_local;
  char *filename_local;
  
  iVar1 = w * h * 3 + 0x36;
  memset(&index,0,0x28);
  index._0_1_ = 0x28;
  memset(local_6b,0,3);
  local_32 = (ulong)CONCAT15((char)((uint)iVar1 >> 0x18),
                             CONCAT14((char)((uint)iVar1 >> 0x10),
                                      CONCAT13((char)((uint)iVar1 >> 8),CONCAT12((char)iVar1,0x4d42)
                                              )));
  *(ulong *)data = local_32;
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '6';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  local_64 = (undefined1)w;
  bmppad[0] = (uchar)(w >> 8);
  bmppad[1] = (uchar)(w >> 0x10);
  bmppad[2] = (uchar)(w >> 0x18);
  memcpy(data + 0xe,&index,0x28);
  return 0x36;
}

Assistant:

static int create_header(char* filename, uint32_t w, uint32_t h, uint8_t* data) {

	uint32_t filesize = BMP_FILE_HEADER_SIZE + BMP_INFO_HEADER_SIZE + w * h * 3;

	unsigned char bmpfileheader[14] = {'B', 'M', 0, 0, 0, 0, 0, 0, 0, 0, 54, 0, 0, 0};
	unsigned char bmpinfoheader[40] = {40, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0, 24, 0};
	unsigned char bmppad[3] = {0, 0, 0};
	
	int index = 0;

	//Write file header
	bmpfileheader[ 2] = (unsigned char)(filesize);
	bmpfileheader[ 3] = (unsigned char)(filesize >> 8);
	bmpfileheader[ 4] = (unsigned char)(filesize >> 16);
	bmpfileheader[ 5] = (unsigned char)(filesize >> 24);

	memcpy(data + index, bmpfileheader, sizeof(bmpfileheader));
	index += sizeof(bmpfileheader);

	//Write info header
	bmpinfoheader[ 4] = (unsigned char)(w);
	bmpinfoheader[ 5] = (unsigned char)(w >> 8);
	bmpinfoheader[ 6] = (unsigned char)(w >> 16);
	bmpinfoheader[ 7] = (unsigned char)(w >> 24);
	bmpinfoheader[ 8] = (unsigned char)(h);
	bmpinfoheader[ 9] = (unsigned char)(h >> 8);
	bmpinfoheader[10] = (unsigned char)(h >> 16);
	bmpinfoheader[11] = (unsigned char)(h >> 24);

	memcpy(data + index, bmpinfoheader, sizeof(bmpinfoheader));
	index += sizeof(bmpinfoheader);

	return index;
}